

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SingleBindingCase::createBuffers(SingleBindingCase *this)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar8;
  int iVar9;
  long lVar10;
  undefined8 *puVar11;
  int v;
  int iVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  allocator<char> local_d1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dataBuf;
  undefined1 local_b8 [8];
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  float local_98;
  float local_94;
  undefined8 local_90;
  float local_88;
  float local_84;
  undefined8 local_80;
  float local_78;
  float local_74;
  undefined8 local_70;
  float local_68;
  float local_64;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long lVar7;
  
  iVar6 = (*((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&dataBuf,(long)((this->m_spec).bufferStride * 0x960 + (this->m_spec).bufferOffset),
             (allocator_type *)local_b8);
  local_48 = 0x3f80000000000000;
  uStack_40 = 0x3f80000000000000;
  local_58 = 0x3f8000003f000000;
  uStack_50 = 0x3f80000000000000;
  iVar6 = 0;
  lVar8 = 0;
  while (lVar8 != 0x14) {
    fVar14 = (float)(int)lVar8 / 20.0;
    fVar14 = fVar14 + fVar14 + -1.0;
    fVar15 = (float)(int)(lVar8 + 1) / 20.0;
    fVar15 = fVar15 + fVar15 + -1.0;
    lVar10 = 0;
    iVar9 = iVar6;
    while (lVar10 != 0x14) {
      uVar1 = lVar10 + lVar8;
      fVar16 = (float)(int)lVar10 / 20.0;
      local_b8._0_4_ = fVar16 + fVar16 + -1.0;
      local_b8._4_4_ = fVar14;
      local_b0 = 0x3f80000000000000;
      local_a8._M_allocated_capacity._0_4_ = local_b8._0_4_;
      local_a8._M_allocated_capacity._4_4_ = fVar15;
      local_a8._8_8_ = 0x3f80000000000000;
      lVar10 = lVar10 + 1;
      fVar16 = (float)(int)lVar10 / 20.0;
      local_98 = fVar16 + fVar16 + -1.0;
      local_94 = fVar15;
      local_90 = 0x3f80000000000000;
      local_88 = (float)local_b8._0_4_;
      local_84 = fVar14;
      local_80 = 0x3f80000000000000;
      local_78 = local_98;
      local_74 = fVar15;
      local_70 = 0x3f80000000000000;
      local_68 = local_98;
      local_64 = fVar14;
      local_60 = 0x3f80000000000000;
      iVar12 = iVar9;
      for (lVar13 = 0; lVar13 != 0x60; lVar13 = lVar13 + 0x10) {
        iVar2 = (this->m_spec).positionAttrOffset;
        iVar3 = (this->m_spec).bufferOffset;
        iVar4 = (this->m_spec).bufferStride;
        uVar5 = *(undefined8 *)((long)&local_b0 + lVar13);
        *(undefined8 *)
         (dataBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start + (iVar4 * iVar12 + iVar2 + iVar3)) =
             *(undefined8 *)(local_b8 + lVar13);
        *(undefined8 *)
         (dataBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start + (iVar4 * iVar12 + iVar2 + iVar3) + 8) = uVar5;
        iVar12 = iVar12 + 1;
      }
      puVar11 = &local_58;
      if ((uVar1 & 1) == 0) {
        puVar11 = &local_48;
      }
      if ((this->m_spec).hasColorAttr == true) {
        for (iVar12 = 0; iVar12 != 6; iVar12 = iVar12 + 1) {
          iVar2 = (this->m_spec).colorAttrOffset;
          iVar3 = (this->m_spec).bufferOffset;
          iVar4 = (this->m_spec).bufferStride;
          uVar5 = puVar11[1];
          *(undefined8 *)
           (dataBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + ((iVar9 + iVar12) * iVar4 + iVar2 + iVar3)) =
               *puVar11;
          *(undefined8 *)
           (dataBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + ((iVar9 + iVar12) * iVar4 + iVar2 + iVar3) + 8) =
               uVar5;
        }
      }
      iVar9 = iVar9 + 6;
    }
    iVar6 = iVar6 + 0x78;
    lVar8 = lVar8 + 1;
  }
  (**(code **)(lVar7 + 0x6c8))(1,&this->m_buf);
  (**(code **)(lVar7 + 0x40))(0x8892,this->m_buf);
  (**(code **)(lVar7 + 0x150))
            (0x8892,(long)dataBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)dataBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start,
             dataBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  (**(code **)(lVar7 + 0x40))(0x8892,0);
  iVar6 = (**(code **)(lVar7 + 0x800))();
  if (iVar6 == 0) {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&dataBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"could not init buffer",&local_d1);
  tcu::TestError::TestError(this_00,(string *)local_b8);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SingleBindingCase::createBuffers (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	std::vector<deUint8>	dataBuf	(m_spec.bufferOffset + m_spec.bufferStride * GRID_SIZE * GRID_SIZE * 6);

	// In interleaved mode color rg and position zw are the same. Select "good" values for r and g
	const tcu::Vec4			colorA	(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4			colorB	(0.5f, 1.0f, 0.0f, 1.0f);

	for (int y = 0; y < GRID_SIZE; ++y)
	for (int x = 0; x < GRID_SIZE; ++x)
	{
		const tcu::Vec4&	color = ((x + y) % 2 == 0) ? (colorA) : (colorB);
		const tcu::Vec4		positions[6] =
		{
			tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
			tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
			tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
			tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
			tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
			tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
		};

		// copy cell vertices to the buffer.
		for (int v = 0; v < 6; ++v)
			memcpy(&dataBuf[m_spec.bufferOffset + m_spec.positionAttrOffset + m_spec.bufferStride * ((y * GRID_SIZE + x) * 6 + v)], positions[v].getPtr(), sizeof(positions[v]));

		// copy color to buffer
		if (m_spec.hasColorAttr)
			for (int v = 0; v < 6; ++v)
				memcpy(&dataBuf[m_spec.bufferOffset + m_spec.colorAttrOffset + m_spec.bufferStride * ((y * GRID_SIZE + x) * 6 + v)], color.getPtr(), sizeof(color));
	}

	gl.genBuffers(1, &m_buf);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_buf);
	gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)dataBuf.size(), &dataBuf[0], GL_STATIC_DRAW);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);

	if (gl.getError() != GL_NO_ERROR)
		throw tcu::TestError("could not init buffer");
}